

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluStrUtil.cpp
# Opt level: O0

ostream * eglu::operator<<(ostream *str,ContextAttribValueFmt *attribFmt)

{
  deUint32 dVar1;
  ostream *poVar2;
  Hex<8UL> hex;
  Enum<int,_2UL> EVar3;
  Enum<int,_2UL> local_50;
  GetNameFunc local_40;
  int local_38;
  Enum<int,_2UL> local_30;
  ContextAttribValueFmt *local_20;
  ContextAttribValueFmt *attribFmt_local;
  ostream *str_local;
  
  dVar1 = attribFmt->attribute;
  local_20 = attribFmt;
  attribFmt_local = (ContextAttribValueFmt *)str;
  if (dVar1 != 0x3028) {
    if (dVar1 == 0x3086) {
      EVar3 = getRenderBufferStr(attribFmt->value);
      local_50.m_getName = EVar3.m_getName;
      local_50.m_value = EVar3.m_value;
      poVar2 = tcu::Format::operator<<(str,&local_50);
      return poVar2;
    }
    if (dVar1 == 0x3097) {
      EVar3 = getAPIStr(attribFmt->value);
      local_40 = EVar3.m_getName;
      local_38 = EVar3.m_value;
      local_30.m_getName = local_40;
      local_30.m_value = local_38;
      poVar2 = tcu::Format::operator<<(str,&local_30);
      return poVar2;
    }
    if (dVar1 != 0x3098) {
      hex = tcu::toHex<int>(attribFmt->value);
      poVar2 = tcu::Format::operator<<(str,hex);
      return poVar2;
    }
  }
  poVar2 = (ostream *)std::ostream::operator<<(str,attribFmt->value);
  return poVar2;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const ContextAttribValueFmt& attribFmt)
{
	switch (attribFmt.attribute)
	{
		case EGL_CONFIG_ID:
		case EGL_CONTEXT_CLIENT_VERSION:
			return str << (int)attribFmt.value;

		case EGL_CONTEXT_CLIENT_TYPE:
			return str << getAPIStr(attribFmt.value);

		case EGL_RENDER_BUFFER:
			return str << getRenderBufferStr(attribFmt.value);

		default:
			return str << tcu::toHex(attribFmt.value);
	}
}